

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O3

int mbedtls_hmac_drbg_random_with_add
              (void *p_rng,uchar *output,size_t out_len,uchar *additional,size_t add_len)

{
  uchar *input;
  byte bVar1;
  int iVar2;
  ulong __n;
  ulong ilen;
  
  bVar1 = mbedtls_md_get_size(*p_rng);
  iVar2 = -3;
  if ((out_len < 0x401) && (iVar2 = -5, add_len < 0x101)) {
    if ((*(long *)((long)p_rng + 0x70) == 0) ||
       ((*(int *)((long)p_rng + 0x68) != 1 &&
        (*(int *)((long)p_rng + 0x58) <= *(int *)((long)p_rng + 0x6c))))) {
      if ((add_len != 0 && additional != (uchar *)0x0) &&
         (iVar2 = mbedtls_hmac_drbg_update_ret
                            ((mbedtls_hmac_drbg_context *)p_rng,additional,add_len), iVar2 != 0)) {
        return iVar2;
      }
    }
    else {
      iVar2 = hmac_drbg_reseed_core((mbedtls_hmac_drbg_context *)p_rng,additional,add_len,0);
      if (iVar2 != 0) {
        return iVar2;
      }
      add_len = 0;
    }
    if (out_len != 0) {
      ilen = (ulong)bVar1;
      input = (uchar *)((long)p_rng + 0x18);
      do {
        __n = ilen;
        if (out_len < ilen) {
          __n = out_len;
        }
        iVar2 = mbedtls_md_hmac_reset((mbedtls_md_context_t *)p_rng);
        if (iVar2 != 0) {
          return iVar2;
        }
        iVar2 = mbedtls_md_hmac_update((mbedtls_md_context_t *)p_rng,input,ilen);
        if (iVar2 != 0) {
          return iVar2;
        }
        iVar2 = mbedtls_md_hmac_finish((mbedtls_md_context_t *)p_rng,input);
        if (iVar2 != 0) {
          return iVar2;
        }
        memcpy(output,input,__n);
        output = output + __n;
        out_len = out_len - __n;
      } while (out_len != 0);
    }
    iVar2 = mbedtls_hmac_drbg_update_ret((mbedtls_hmac_drbg_context *)p_rng,additional,add_len);
    if (iVar2 == 0) {
      *(int *)((long)p_rng + 0x58) = *(int *)((long)p_rng + 0x58) + 1;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_hmac_drbg_random_with_add( void *p_rng,
                               unsigned char *output, size_t out_len,
                               const unsigned char *additional, size_t add_len )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_hmac_drbg_context *ctx = (mbedtls_hmac_drbg_context *) p_rng;
    size_t md_len = mbedtls_md_get_size( ctx->md_ctx.md_info );
    size_t left = out_len;
    unsigned char *out = output;

    /* II. Check request length */
    if( out_len > MBEDTLS_HMAC_DRBG_MAX_REQUEST )
        return( MBEDTLS_ERR_HMAC_DRBG_REQUEST_TOO_BIG );

    /* III. Check input length */
    if( add_len > MBEDTLS_HMAC_DRBG_MAX_INPUT )
        return( MBEDTLS_ERR_HMAC_DRBG_INPUT_TOO_BIG );

    /* 1. (aka VII and IX) Check reseed counter and PR */
    if( ctx->f_entropy != NULL && /* For no-reseeding instances */
        ( ctx->prediction_resistance == MBEDTLS_HMAC_DRBG_PR_ON ||
          ctx->reseed_counter > ctx->reseed_interval ) )
    {
        if( ( ret = mbedtls_hmac_drbg_reseed( ctx, additional, add_len ) ) != 0 )
            return( ret );

        add_len = 0; /* VII.4 */
    }

    /* 2. Use additional data if any */
    if( additional != NULL && add_len != 0 )
    {
        if( ( ret = mbedtls_hmac_drbg_update_ret( ctx,
                                                  additional, add_len ) ) != 0 )
            goto exit;
    }

    /* 3, 4, 5. Generate bytes */
    while( left != 0 )
    {
        size_t use_len = left > md_len ? md_len : left;

        if( ( ret = mbedtls_md_hmac_reset( &ctx->md_ctx ) ) != 0 )
            goto exit;
        if( ( ret = mbedtls_md_hmac_update( &ctx->md_ctx,
                                            ctx->V, md_len ) ) != 0 )
            goto exit;
        if( ( ret = mbedtls_md_hmac_finish( &ctx->md_ctx, ctx->V ) ) != 0 )
            goto exit;

        memcpy( out, ctx->V, use_len );
        out += use_len;
        left -= use_len;
    }

    /* 6. Update */
    if( ( ret = mbedtls_hmac_drbg_update_ret( ctx,
                                              additional, add_len ) ) != 0 )
        goto exit;

    /* 7. Update reseed counter */
    ctx->reseed_counter++;

exit:
    /* 8. Done */
    return( ret );
}